

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O1

int tbx_readrec(BGZF *fp,void *tbxv,void *sv,int *tid,int *beg,int *end)

{
  char cVar1;
  int iVar2;
  int iVar3;
  khint_t kVar4;
  kh_s2i_t *pkVar5;
  tbx_intv_t intv;
  tbx_intv_t local_58;
  
  iVar2 = bgzf_getline(fp,10,(kstring_t *)sv);
  if (-1 < iVar2) {
    iVar3 = tbx_parse1((tbx_conf_t *)tbxv,*sv,*(char **)((long)sv + 0x10),&local_58);
    if (iVar3 == 0) {
      cVar1 = *local_58.se;
      *local_58.se = '\0';
      if (*(long *)((long)tbxv + 0x20) == 0) {
        pkVar5 = kh_init_s2i();
        *(kh_s2i_t **)((long)tbxv + 0x20) = pkVar5;
      }
      pkVar5 = *(kh_s2i_t **)((long)tbxv + 0x20);
      kVar4 = kh_get_s2i(pkVar5,local_58.ss);
      local_58.tid = -1;
      if (kVar4 != pkVar5->n_buckets) {
        local_58.tid = (int)pkVar5->vals[kVar4];
      }
      *local_58.se = cVar1;
    }
    else {
      tbx_readrec_cold_1();
    }
    *tid = local_58.tid;
    *beg = (int)local_58.beg;
    *end = (int)local_58.end;
  }
  return iVar2;
}

Assistant:

int tbx_readrec(BGZF *fp, void *tbxv, void *sv, int *tid, int *beg, int *end)
{
    tbx_t *tbx = (tbx_t *) tbxv;
    kstring_t *s = (kstring_t *) sv;
    int ret;
    if ((ret = bgzf_getline(fp, '\n', s)) >= 0) {
        tbx_intv_t intv;
        get_intv(tbx, s, &intv, 0);
        *tid = intv.tid; *beg = intv.beg; *end = intv.end;
    }
    return ret;
}